

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall DifferingTypesTest::assignmentTest(DifferingTypesTest *this)

{
  short sVar1;
  short sVar2;
  int iVar3;
  value_type vVar4;
  reference psVar5;
  reference pfVar6;
  reference piVar7;
  size_t j_5;
  size_t j;
  ulong uVar8;
  size_t j_1;
  size_t j_2;
  size_t shape_1 [3];
  View<short,_false,_std::allocator<unsigned_long>_> v;
  size_t shape [3];
  bool local_101;
  BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
  local_100;
  unsigned_long local_e8 [3];
  Marray<int,_std::allocator<unsigned_long>_> local_d0;
  Marray<int,_std::allocator<unsigned_long>_> local_88;
  short *local_38;
  
  local_88.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ = (pointer)0x3;
  local_88.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_._0_8_ = 2;
  local_88.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.shape_ = (size_t *)0x4;
  local_38 = this->dataShort_;
  andres::View<short,false,std::allocator<unsigned_long>>::View<unsigned_long*>
            ((View<short,false,std::allocator<unsigned_long>> *)&local_d0,(unsigned_long *)&local_88
             ,(unsigned_long *)
              &local_88.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
               shapeStrides_,local_38,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_e8);
  local_e8[0] = CONCAT62(local_e8[0]._2_6_,2);
  andres::View<short,_false,_std::allocator<unsigned_long>_>::operator=
            ((View<short,_false,_std::allocator<unsigned_long>_> *)&local_d0,(short *)local_e8);
  for (uVar8 = 0;
      uVar8 < local_d0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_;
      uVar8 = uVar8 + 1) {
    psVar5 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<short,_false,_std::allocator<unsigned_long>_> *)&local_d0,uVar8);
    local_e8[0] = CONCAT71(local_e8[0]._1_7_,*psVar5 == 2);
    test((bool *)local_e8);
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&local_d0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  local_e8[0] = 3;
  local_e8[1] = 2;
  local_e8[2] = 4;
  andres::View<int,false,std::allocator<unsigned_long>>::View<unsigned_long*>
            ((View<int,false,std::allocator<unsigned_long>> *)&local_d0,local_e8,
             (unsigned_long *)&local_d0,this->dataInt_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_88);
  andres::View<float,_true,_std::allocator<unsigned_long>_>::View
            ((View<float,_true,_std::allocator<unsigned_long>_> *)&local_88,
             (allocator_type *)&local_100);
  andres::View<float,true,std::allocator<unsigned_long>>::operator=
            ((View<float,true,std::allocator<unsigned_long>> *)&local_88,
             &local_d0.super_View<int,_false,_std::allocator<unsigned_long>_>);
  for (uVar8 = 0;
      uVar8 < local_d0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_;
      uVar8 = uVar8 + 1) {
    pfVar6 = andres::View<float,_true,_std::allocator<unsigned_long>_>::operator()
                       ((View<float,_true,_std::allocator<unsigned_long>_> *)&local_88,uVar8);
    local_100.e1_._0_1_ = *pfVar6 == (float)this->dataInt_[uVar8];
    test((bool *)&local_100);
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&local_88.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&local_d0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  local_e8[0] = 3;
  local_e8[1] = 2;
  local_e8[2] = 4;
  andres::View<short,false,std::allocator<unsigned_long>>::View<unsigned_long*>
            ((View<short,false,std::allocator<unsigned_long>> *)&local_d0,local_e8,
             (unsigned_long *)&local_d0,local_38,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_88);
  andres::View<int,false,std::allocator<unsigned_long>>::View<unsigned_long*>
            ((View<int,false,std::allocator<unsigned_long>> *)&local_88,local_e8,
             (unsigned_long *)&local_d0,this->dataInt_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_100);
  andres::
  BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
  ::BinaryViewExpression
            (&local_100,
             (ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short> *)
             &local_d0,
             (ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short> *)
             &local_d0);
  andres::marray_detail::
  operate<andres::marray_detail::Assign<int,short>,int,std::allocator<unsigned_long>,andres::BinaryViewExpression<andres::View<short,false,std::allocator<unsigned_long>>,short,andres::View<short,false,std::allocator<unsigned_long>>,short,andres::marray_detail::Plus<short,short,short>>,short>
            (&local_88,&local_100);
  for (uVar8 = 0;
      uVar8 < local_88.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_;
      uVar8 = uVar8 + 1) {
    piVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                       (&local_88.super_View<int,_false,_std::allocator<unsigned_long>_>,uVar8);
    iVar3 = *piVar7;
    andres::
    BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
    ::BinaryViewExpression
              (&local_100,
               (ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short> *)
               &local_d0,
               (ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short> *)
               &local_d0);
    vVar4 = andres::
            BinaryViewExpression<andres::View<short,false,std::allocator<unsigned_long>>,short,andres::View<short,false,std::allocator<unsigned_long>>,short,andres::marray_detail::Plus<short,short,short>>
            ::operator()((BinaryViewExpression<andres::View<short,false,std::allocator<unsigned_long>>,short,andres::View<short,false,std::allocator<unsigned_long>>,short,andres::marray_detail::Plus<short,short,short>>
                          *)&local_100,uVar8);
    local_101 = iVar3 == vVar4;
    test(&local_101);
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&local_88.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&local_d0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  local_88.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ = (pointer)0x3;
  local_88.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_._0_8_ = 2;
  local_88.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.shape_ = (size_t *)0x4;
  local_e8[0] = local_e8[0] & 0xffffffffffff0000;
  andres::Marray<short,std::allocator<unsigned_long>>::Marray<unsigned_long*>
            ((Marray<short,std::allocator<unsigned_long>> *)&local_d0,(unsigned_long *)&local_88,
             (unsigned_long *)
             &local_88.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
              shapeStrides_,(short *)local_e8,&andres::defaultOrder,(allocator_type *)&local_100);
  local_e8[0] = CONCAT62(local_e8[0]._2_6_,2);
  andres::Marray<short,_std::allocator<unsigned_long>_>::operator=
            ((Marray<short,_std::allocator<unsigned_long>_> *)&local_d0,(short *)local_e8);
  for (uVar8 = 0;
      uVar8 < local_d0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_;
      uVar8 = uVar8 + 1) {
    psVar5 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<short,_false,_std::allocator<unsigned_long>_> *)&local_d0,uVar8);
    local_e8[0] = CONCAT71(local_e8[0]._1_7_,*psVar5 == 2);
    test((bool *)local_e8);
  }
  andres::Marray<short,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<short,_std::allocator<unsigned_long>_> *)&local_d0);
  local_e8[0] = 3;
  local_e8[1] = 2;
  local_e8[2] = 4;
  andres::View<short,false,std::allocator<unsigned_long>>::View<unsigned_long*>
            ((View<short,false,std::allocator<unsigned_long>> *)&local_88,local_e8,
             (unsigned_long *)&local_d0,local_38,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_d0);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            (&local_d0,(allocator_type *)&local_100);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)&local_d0,
             (View<short,_false,_std::allocator<unsigned_long>_> *)&local_88);
  local_100.e1_._0_1_ =
       local_88.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
       local_d0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_;
  test((bool *)&local_100);
  for (uVar8 = 0;
      uVar8 < local_88.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_;
      uVar8 = uVar8 + 1) {
    psVar5 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<short,_false,_std::allocator<unsigned_long>_> *)&local_88,uVar8);
    sVar1 = *psVar5;
    piVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                       (&local_d0.super_View<int,_false,_std::allocator<unsigned_long>_>,uVar8);
    local_100.e1_._0_1_ = *piVar7 == (int)sVar1;
    test((bool *)&local_100);
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&local_d0);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&local_88.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  local_e8[0] = 3;
  local_e8[1] = 2;
  local_e8[2] = 4;
  andres::View<short,false,std::allocator<unsigned_long>>::View<unsigned_long*>
            ((View<short,false,std::allocator<unsigned_long>> *)&local_88,local_e8,
             (unsigned_long *)&local_d0,local_38,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_d0);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            (&local_d0,(allocator_type *)&local_100);
  andres::
  BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
  ::BinaryViewExpression
            (&local_100,
             (ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short> *)
             &local_88,
             (ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short> *)
             &local_88);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)&local_d0,
             (ViewExpression<andres::BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>,_short>
              *)&local_100);
  local_100.e1_._0_1_ =
       local_88.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
       local_d0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_;
  test((bool *)&local_100);
  for (uVar8 = 0;
      uVar8 < local_88.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_;
      uVar8 = uVar8 + 1) {
    psVar5 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<short,_false,_std::allocator<unsigned_long>_> *)&local_88,uVar8);
    sVar1 = *psVar5;
    psVar5 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<short,_false,_std::allocator<unsigned_long>_> *)&local_88,uVar8);
    sVar2 = *psVar5;
    piVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                       (&local_d0.super_View<int,_false,_std::allocator<unsigned_long>_>,uVar8);
    local_100.e1_._0_1_ = (int)sVar2 + (int)sVar1 == *piVar7;
    test((bool *)&local_100);
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&local_d0);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&local_88.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  local_e8[0] = 3;
  local_e8[1] = 2;
  local_e8[2] = 4;
  local_88.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ =
       (pointer)((ulong)local_88.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ &
                0xffffffffffff0000);
  andres::Marray<short,std::allocator<unsigned_long>>::Marray<unsigned_long*>
            ((Marray<short,std::allocator<unsigned_long>> *)&local_d0,local_e8,
             (unsigned_long *)&local_d0,(short *)&local_88,&andres::defaultOrder,
             (allocator_type *)&local_100);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            (&local_88,(allocator_type *)&local_100);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)&local_88,
             (View<short,_false,_std::allocator<unsigned_long>_> *)&local_d0);
  local_100.e1_._0_1_ =
       local_88.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
       local_d0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_;
  test((bool *)&local_100);
  for (uVar8 = 0;
      uVar8 < local_88.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_;
      uVar8 = uVar8 + 1) {
    piVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                       (&local_88.super_View<int,_false,_std::allocator<unsigned_long>_>,uVar8);
    iVar3 = *piVar7;
    psVar5 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<short,_false,_std::allocator<unsigned_long>_> *)&local_d0,uVar8);
    local_100.e1_._0_1_ = iVar3 == *psVar5;
    test((bool *)&local_100);
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&local_88);
  andres::Marray<short,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<short,_std::allocator<unsigned_long>_> *)&local_d0);
  return;
}

Assistant:

void DifferingTypesTest::assignmentTest()
{
    // View
    {
        // from constant
        {
            std::size_t shape[] = {3, 2, 4};
            andres::View<short> v(shape, shape+3, dataShort_);
            v = 2;
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == 2);
            }
        }
        // from View
        { 
            // compilers may issue a warning here
            if(sizeof(float) == sizeof(int)) {
                std::size_t shape[] = {3, 2, 4};
                andres::View<int> v(shape, shape+3, dataInt_);
                andres::View<float, true> w;
                w = v;
                for(std::size_t j=0; j<v.size(); ++j) {
                    test( w(j) == *static_cast<float*>(
                        static_cast<void*>(&dataInt_[j])));
                }
            }
        }
        // from ViewExpression
        { 
            std::size_t shape[] = {3, 2, 4};
            andres::View<short> v(shape, shape+3, dataShort_);
            andres::View<int> w(shape, shape+3, dataInt_);
            w = v + v;
            for(std::size_t j=0; j<w.size(); ++j) {
                test(w(j) == (v + v)(j));
            }
        }
    }
    // Marray
    {
        // from constant
        {
            std::size_t shape[] = {3, 2, 4};
            andres::Marray<short> m(shape, shape+3);
            m = 2;
            for(std::size_t j=0; j<m.size(); ++j) {
                test(m(j) == 2);
            }
        }
        // from View 
        {
            std::size_t shape[] = {3, 2, 4};
            andres::View<short> v(shape, shape+3, dataShort_);
            andres::Marray<int> m;
            m = v;
            test(v.size() == m.size());
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == m(j));
            }
        }
        // from ViewExpression
        {
            std::size_t shape[] = {3, 2, 4};
            andres::View<short> v(shape, shape+3, dataShort_);
            andres::Marray<int> m;
            m = v + v;
            test(v.size() == m.size());
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j)+v(j) == m(j));
            }
        }
        // from Marray
        {
            std::size_t shape[] = {3, 2, 4};
            andres::Marray<short> m(shape, shape+3);
            andres::Marray<int> n;
            n = m;
            test(n.size() == m.size());
            for(std::size_t j=0; j<n.size(); ++j) {
                test(n(j) == m(j));
            }
        }
    }
}